

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O2

void Iex_3_4::setFpExceptionHandler(FpExceptionHandler handler)

{
  sigaction action;
  
  if ((anonymous_namespace)::fpeHandler == (FpExceptionHandler)0x0) {
    sigemptyset((sigset_t *)&action.sa_mask);
    action.sa_flags = 0x40000004;
    action.__sigaction_handler.sa_handler = catchSigFpe;
    action.sa_restorer = (_func_void *)0x0;
    sigaction(8,(sigaction *)&action,(sigaction *)0x0);
  }
  (anonymous_namespace)::fpeHandler = handler;
  return;
}

Assistant:

void
setFpExceptionHandler (FpExceptionHandler handler)
{
    if (fpeHandler == 0)
    {
        struct sigaction action;
        sigemptyset (&action.sa_mask);
        action.sa_flags     = SA_SIGINFO | SA_NOMASK;
        action.sa_sigaction = (void (*) (int, siginfo_t*, void*)) catchSigFpe;
        action.sa_restorer  = 0;

        sigaction (SIGFPE, &action, 0);
    }

    fpeHandler = handler;
}